

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int width;
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  int iVar4;
  char *pcVar5;
  stringstream *dmin;
  int window_size;
  long *local_388 [2];
  long local_378 [2];
  string output_file;
  double scale;
  double weight;
  double baseline;
  double focal_length;
  void *local_328;
  undefined8 uStack_320;
  long local_318;
  string output2_file;
  _InputArray local_2e8;
  Mat image2;
  long local_2c0;
  Mat image1;
  long local_260;
  int *local_230;
  stringstream out1;
  long local_200 [12];
  Mat local_1a0 [16];
  ios_base local_190 [80];
  Mat local_140 [184];
  Mat naive_disparities;
  
  focal_length = 1247.0;
  baseline = 213.0;
  window_size = 3;
  weight = 500.0;
  scale = 3.0;
  if (argc < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar5 = *argv;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1080e8);
    }
    else {
      sVar1 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out1,argv[1],(allocator<char> *)&image2);
  cv::imread((string *)&image1,(int)&out1);
  if (_out1 != local_200) {
    operator_delete(_out1,local_200[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out1,argv[2],(allocator<char> *)&naive_disparities);
  cv::imread((string *)&image2,(int)&out1);
  if (_out1 != local_200) {
    operator_delete(_out1,local_200[0] + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output_file,argv[3],(allocator<char> *)&out1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output2_file,argv[4],(allocator<char> *)&out1);
  if (local_260 == 0) {
    pcVar5 = "No image1 data";
  }
  else {
    if (local_2c0 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"------------------ Parameters -------------------",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"focal_length = ",0xf);
      poVar2 = std::ostream::_M_insert<double>(1247.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"baseline = ",0xb);
      poVar2 = std::ostream::_M_insert<double>(213.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"window_size = ",0xe)
      ;
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,3);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"occlusion weights = ",0x14);
      poVar2 = std::ostream::_M_insert<double>(500.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"disparity added due to image cropping = ",0x28);
      plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x43);
      std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
      std::ostream::put((char)plVar3);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"scaling of disparity images to show = ",0x26);
      poVar2 = std::ostream::_M_insert<double>(3.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"output filename = ",0x12);
      pcVar5 = argv[3];
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080b8);
      }
      else {
        sVar1 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"-------------------------------------------------",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      iVar4 = *local_230;
      width = local_230[1];
      cv::Mat::zeros((int)&out1,iVar4,width);
      cv::Mat::Mat(&naive_disparities);
      dmin = &out1;
      (**(code **)(*_out1 + 0x18))(_out1,dmin,&naive_disparities,0xffffffff);
      cv::Mat::~Mat(local_140);
      cv::Mat::~Mat(local_1a0);
      cv::Mat::~Mat((Mat *)local_200);
      StereoEstimation_Naive
                (&window_size,(int *)dmin,iVar4,width,&image1,&image2,&naive_disparities,&scale);
      Disparity2PointCloud
                (&output_file,iVar4,width,&naive_disparities,&window_size,(int *)&baseline,&baseline
                 ,&focal_length);
      std::__cxx11::stringstream::stringstream((stringstream *)&out1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_200,output_file._M_dataplus._M_p,
                          output_file._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_naive.png",10);
      std::__cxx11::stringbuf::str();
      local_2e8.sz.width = 0;
      local_2e8.sz.height = 0;
      local_2e8.flags = 0x1010000;
      local_318 = 0;
      local_328 = (void *)0x0;
      uStack_320 = 0;
      local_2e8.obj = &naive_disparities;
      cv::imwrite((string *)local_388,&local_2e8,(vector *)&local_328);
      if (local_328 != (void *)0x0) {
        operator_delete(local_328,local_318 - (long)local_328);
      }
      if (local_388[0] != local_378) {
        operator_delete(local_388[0],local_378[0] + 1);
      }
      local_388[0] = local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Naive","");
      cv::namedWindow((string *)local_388,1);
      if (local_388[0] != local_378) {
        operator_delete(local_388[0],local_378[0] + 1);
      }
      local_388[0] = local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Naive","");
      local_2e8.sz.width = 0;
      local_2e8.sz.height = 0;
      local_2e8.flags = 0x1010000;
      local_2e8.obj = &naive_disparities;
      cv::imshow((string *)local_388,&local_2e8);
      if (local_388[0] != local_378) {
        operator_delete(local_388[0],local_378[0] + 1);
      }
      StereoEstimation_Dynamic(&window_size,iVar4,width,&image1,&image2,&weight,&output2_file);
      iVar4 = 0;
      cv::waitKey(0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&out1);
      std::ios_base::~ios_base(local_190);
      cv::Mat::~Mat(&naive_disparities);
      goto LAB_00102b2d;
    }
    pcVar5 = "No image2 data";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,0xe);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
  std::ostream::put(-0x18);
  iVar4 = 1;
  std::ostream::flush();
LAB_00102b2d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output2_file._M_dataplus._M_p != &output2_file.field_2) {
    operator_delete(output2_file._M_dataplus._M_p,output2_file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output_file._M_dataplus._M_p != &output_file.field_2) {
    operator_delete(output_file._M_dataplus._M_p,output_file.field_2._M_allocated_capacity + 1);
  }
  cv::Mat::~Mat(&image2);
  cv::Mat::~Mat(&image1);
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {

  ////////////////
  // Parameters //
  ////////////////

  // camera setup parameters
  const double focal_length = 1247;
  const double baseline = 213;

  // stereo estimation parameters
  const int dmin = 67;
  const int window_size = 3;
  const double weight = 500;
  const double scale = 3;

  ///////////////////////////
  // Commandline arguments //
  ///////////////////////////
  int x = argc;
  if (argc < 4) {
    std::cerr << "Usage: " << argv[0] << " IMAGE1 IMAGE2 OUTPUT_FILE OUTPUT_FILE2" << std::endl;
    return 1;
  }

  cv::Mat image1 = cv::imread(argv[1], cv::IMREAD_GRAYSCALE);
  cv::Mat image2 = cv::imread(argv[2], cv::IMREAD_GRAYSCALE);
  const std::string output_file = argv[3];
  const std::string output2_file = argv[4];

  if (!image1.data) {
    std::cerr << "No image1 data" << std::endl;
    return EXIT_FAILURE;
  }

  if (!image2.data) {
    std::cerr << "No image2 data" << std::endl;
    return EXIT_FAILURE;
  }

  std::cout << "------------------ Parameters -------------------" << std::endl;
  std::cout << "focal_length = " << focal_length << std::endl;
  std::cout << "baseline = " << baseline << std::endl;
  std::cout << "window_size = " << window_size << std::endl;
  std::cout << "occlusion weights = " << weight << std::endl;
  std::cout << "disparity added due to image cropping = " << dmin << std::endl;
  std::cout << "scaling of disparity images to show = " << scale << std::endl;
  std::cout << "output filename = " << argv[3] << std::endl;
  std::cout << "-------------------------------------------------" << std::endl;

   int height = image1.size().height;
   int width = image1.size().width;

  ////////////////////
  // Reconstruction //
  ////////////////////

  // Naive disparity image
 
  cv::Mat naive_disparities = cv::Mat::zeros(height, width, CV_8UC1);
  

  StereoEstimation_Naive(
    window_size, dmin, height, width,
    image1, image2,
    naive_disparities, scale);

  ////////////
  // Output //
  ////////////

  // reconstruction
  Disparity2PointCloud(
    output_file,
    height, width, naive_disparities,
    window_size, dmin, baseline, focal_length);

  // save / display images
  std::stringstream out1;
  out1 << output_file << "_naive.png";
  cv::imwrite(out1.str(), naive_disparities);

  cv::namedWindow("Naive", cv::WINDOW_AUTOSIZE);
  cv::imshow("Naive", naive_disparities);

  // Dynamic disparity image
  StereoEstimation_Dynamic(
      window_size,
      height,
      width,
      image1, image2, weight, output2_file); // disparity image is decalred in the function


  cv::waitKey(0);

  return 0;
}